

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_diag.c
# Opt level: O3

int CVDiagFree(CVodeMem cv_mem)

{
  void *__ptr;
  
  __ptr = cv_mem->cv_lmem;
  N_VDestroy(*(undefined8 *)((long)__ptr + 8));
  N_VDestroy(*(undefined8 *)((long)__ptr + 0x10));
  N_VDestroy(*(undefined8 *)((long)__ptr + 0x18));
  free(__ptr);
  cv_mem->cv_lmem = (void *)0x0;
  return 0;
}

Assistant:

static int CVDiagFree(CVodeMem cv_mem)
{
  CVDiagMem cvdiag_mem;

  cvdiag_mem = (CVDiagMem)lmem;

  N_VDestroy(M);
  N_VDestroy(bit);
  N_VDestroy(bitcomp);
  free(cvdiag_mem);
  cv_mem->cv_lmem = NULL;

  return (0);
}